

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

Token * __thiscall FileTokenizer::loadToken(Token *__return_storage_ptr__,FileTokenizer *this)

{
  bool bVar1;
  bool bVar2;
  char32_t cVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  size_t sVar8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  FileTokenizer *args;
  bool local_251;
  byte local_23a;
  byte local_239;
  bool local_201;
  byte local_1a9;
  undefined1 local_158 [7];
  bool textLowered;
  string text;
  undefined1 local_118 [8];
  string text_2;
  char32_t value_3;
  size_t characterStart;
  undefined1 local_e0 [6];
  bool isFirst;
  double local_c0;
  double value_2;
  int64_t value_1;
  bool isFloat;
  bool isHex;
  bool foundExpSign;
  bool foundExp;
  bool foundPoint;
  size_t sStack_a8;
  bool isValid;
  size_t end;
  size_t start;
  string local_90;
  byte local_59;
  undefined1 local_58 [7];
  bool valid;
  string text_1;
  int64_t value;
  size_t decodePos;
  size_t sStack_20;
  char first;
  size_t pos;
  FileTokenizer *this_local;
  
  pos = (size_t)this;
  this_local = (FileTokenizer *)__return_storage_ptr__;
  bVar1 = isInputAtEnd(this);
  if (bVar1) {
    createToken(this,Invalid,0);
    Token::Token(__return_storage_ptr__,&this->token);
  }
  else {
    sStack_20 = this->linePos;
    if ((this->equActive & 1U) == 0) {
      bVar1 = parseOperator(this);
      if (bVar1) {
        Token::Token(__return_storage_ptr__,&this->token);
      }
      else {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
        decodePos._7_1_ = *pcVar6;
        if (decodePos._7_1_ == '\'') {
          value = sStack_20 + 1;
          cVar3 = anon_unknown.dwarf_1033bf::decodeUtf8Character
                            (&this->currentLine,(size_t *)&value);
          text_1.field_2._8_8_ = ZEXT48((uint)cVar3);
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
          if (*pcVar6 == '\'') {
            createToken(this,Integer,(value + 1) - sStack_20,text_1.field_2._8_8_);
            Token::Token(__return_storage_ptr__,&this->token);
            return __return_storage_ptr__;
          }
        }
        if (decodePos._7_1_ == '\"') {
          std::__cxx11::string::string((string *)local_58);
          sStack_20 = sStack_20 + 1;
          local_59 = 0;
          while (uVar7 = sStack_20, uVar5 = std::__cxx11::string::size(), uVar7 < uVar5) {
            uVar7 = sStack_20 + 1;
            uVar5 = std::__cxx11::string::size();
            if ((uVar7 < uVar5) &&
               (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine),
               *pcVar6 == '\\')) {
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
              if (*pcVar6 == '\"') {
                std::__cxx11::string::operator+=((string *)local_58,'\"');
                sStack_20 = sStack_20 + 2;
              }
              else {
                pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
                if (*pcVar6 != '\\') goto LAB_001961e8;
                std::__cxx11::string::operator+=((string *)local_58,'\\');
                sStack_20 = sStack_20 + 2;
              }
            }
            else {
LAB_001961e8:
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
              if (*pcVar6 == '\"') {
                sStack_20 = sStack_20 + 1;
                local_59 = 1;
                break;
              }
              sStack_20 = sStack_20 + 1;
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
              std::__cxx11::string::operator+=((string *)local_58,*pcVar6);
            }
          }
          if ((local_59 & 1) == 0) {
            sVar8 = sStack_20 - this->linePos;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_90,"Unexpected end of line in string constant",
                       (allocator<char> *)((long)&start + 7));
            createToken(this,Invalid,sVar8,&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
            Token::Token(__return_storage_ptr__,&this->token);
          }
          else {
            createToken(this,String,sStack_20 - this->linePos,(string *)local_58);
            Token::Token(__return_storage_ptr__,&this->token);
          }
          start._0_4_ = 1;
          std::__cxx11::string::~string((string *)local_58);
        }
        else if ((decodePos._7_1_ < '0') || ('9' < decodePos._7_1_)) {
          characterStart._6_1_ = 1;
          while( true ) {
            uVar7 = sStack_20;
            uVar5 = std::__cxx11::string::size();
            local_251 = false;
            if (uVar7 < uVar5) {
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
              local_251 = SymbolTable::isValidSymbolCharacter
                                    (*pcVar6,(bool)(characterStart._6_1_ & 1));
            }
            sVar8 = sStack_20;
            if (local_251 == false) break;
            sStack_20 = sStack_20 + 1;
            characterStart._6_1_ = 0;
          }
          if (sStack_20 == this->linePos) {
            args = this;
            text_2.field_2._12_4_ =
                 anon_unknown.dwarf_1033bf::decodeUtf8Character
                           (&this->currentLine,&stack0xffffffffffffffe0);
            convertUnicodeCharToUtf8_abi_cxx11_
                      ((string *)(text.field_2._M_local_buf + 8),text_2.field_2._12_4_);
            tinyformat::format<std::__cxx11::string>
                      ((string *)local_118,(tinyformat *)"Invalid input \'%s\'",
                       text.field_2._M_local_buf + 8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            std::__cxx11::string::~string((string *)(text.field_2._M_local_buf + 8));
            createToken(this,Invalid,sStack_20 - sVar8,(string *)local_118);
            Token::Token(__return_storage_ptr__,&this->token);
            start._0_4_ = 1;
            std::__cxx11::string::~string((string *)local_118);
          }
          else {
            std::__cxx11::string::substr((ulong)local_158,(ulong)&this->currentLine);
            _Var9._M_current = (char *)std::__cxx11::string::begin();
            _Var10._M_current = (char *)std::__cxx11::string::end();
            bVar1 = std::
                    any_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(unsigned_int)noexcept>
                              (_Var9,_Var10,iswupper);
            if (bVar1) {
              _Var9._M_current = (char *)std::__cxx11::string::begin();
              _Var10._M_current = (char *)std::__cxx11::string::end();
              __result._M_current = (char *)std::__cxx11::string::begin();
              std::
              transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                        (_Var9,_Var10,__result,tolower);
            }
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_158,"equ");
            if (bVar2) {
              createToken(this,Equ,sStack_20 - this->linePos);
              this->equActive = true;
            }
            else if (bVar1) {
              createToken(this,Identifier,sStack_20 - this->linePos,(string *)local_158);
            }
            else {
              createTokenCurrentString(this,Identifier,sStack_20 - this->linePos);
            }
            Token::Token(__return_storage_ptr__,&this->token);
            start._0_4_ = 1;
            std::__cxx11::string::~string((string *)local_158);
          }
        }
        else {
          end = sStack_20;
          sStack_a8 = sStack_20;
          value_1._7_1_ = 1;
          value_1._6_1_ = 0;
          value_1._5_1_ = 0;
          value_1._4_1_ = 0;
          uVar7 = sStack_20 + 1;
          uVar5 = std::__cxx11::string::size();
          local_201 = false;
          if (uVar7 < uVar5) {
            pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
            local_201 = false;
            if (*pcVar6 == '0') {
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
              iVar4 = tolower((int)*pcVar6);
              local_201 = iVar4 == 0x78;
            }
          }
          value_1._3_1_ = local_201;
          while( true ) {
            uVar7 = sStack_a8;
            uVar5 = std::__cxx11::string::size();
            bVar1 = false;
            if (uVar7 < uVar5) {
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
              iVar4 = isalnum((int)*pcVar6);
              bVar1 = true;
              if (iVar4 == 0) {
                pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
                bVar1 = *pcVar6 == '.';
              }
            }
            if (!bVar1) break;
            pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
            if (*pcVar6 == '.') {
              if (((value_1._5_1_ & 1) != 0) || ((value_1._6_1_ & 1) != 0)) {
                value_1._7_1_ = 0;
              }
              value_1._6_1_ = 1;
            }
            else {
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
              iVar4 = tolower((int)*pcVar6);
              if ((iVar4 == 0x68) && ((value_1._4_1_ & 1) == 0)) {
                value_1._3_1_ = 1;
              }
              else {
                pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine);
                iVar4 = tolower((int)*pcVar6);
                if ((iVar4 == 0x65) && ((value_1._3_1_ & 1) == 0)) {
                  if ((value_1._5_1_ & 1) == 0) {
                    uVar7 = sStack_a8 + 1;
                    uVar5 = std::__cxx11::string::size();
                    if ((uVar7 < uVar5) &&
                       ((pcVar6 = (char *)std::__cxx11::string::operator[]
                                                    ((ulong)&this->currentLine), *pcVar6 == '+' ||
                        (pcVar6 = (char *)std::__cxx11::string::operator[]
                                                    ((ulong)&this->currentLine), *pcVar6 == '-'))))
                    {
                      uVar7 = sStack_a8 + 2;
                      sStack_a8 = sStack_a8 + 1;
                      uVar5 = std::__cxx11::string::size();
                      if (uVar7 < uVar5) {
                        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&this->currentLine)
                        ;
                        iVar4 = isalnum((int)*pcVar6);
                        if (iVar4 == 0) goto LAB_0019671b;
                      }
                      else {
LAB_0019671b:
                        value_1._7_1_ = 0;
                      }
                      value_1._4_1_ = 1;
                    }
                  }
                  else {
                    value_1._7_1_ = 0;
                  }
                  value_1._5_1_ = 1;
                }
              }
            }
            sStack_a8 = sStack_a8 + 1;
          }
          local_239 = 1;
          if ((value_1._6_1_ & 1) == 0) {
            local_23a = 0;
            if ((value_1._5_1_ & 1) != 0) {
              local_23a = value_1._3_1_ ^ 0xff;
            }
            local_239 = local_23a;
          }
          value_1._2_1_ = local_239 & 1;
          if (value_1._2_1_ == 0) {
            bVar1 = convertInteger(this,end,sStack_a8,(int64_t *)&value_2);
            if (!bVar1) {
              createTokenCurrentString(this,NumberString,sStack_a8 - end);
              Token::Token(__return_storage_ptr__,&this->token);
              return __return_storage_ptr__;
            }
            createToken(this,Integer,sStack_a8 - end,(int64_t)value_2);
          }
          else {
            if ((value_1._7_1_ & 1) == 0) {
              sVar8 = sStack_a8 - end;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_e0,"Invalid floating point number",
                         (allocator<char> *)((long)&characterStart + 7));
              createToken(this,Invalid,sVar8,(string *)local_e0);
              std::__cxx11::string::~string((string *)local_e0);
              std::allocator<char>::~allocator((allocator<char> *)((long)&characterStart + 7));
              Token::Token(__return_storage_ptr__,&this->token);
              return __return_storage_ptr__;
            }
            bVar1 = convertFloat(this,end,sStack_a8,&local_c0);
            if (!bVar1) {
              createTokenCurrentString(this,NumberString,sStack_a8 - end);
              Token::Token(__return_storage_ptr__,&this->token);
              return __return_storage_ptr__;
            }
            createToken(this,Float,sStack_a8 - end,local_c0);
          }
          Token::Token(__return_storage_ptr__,&this->token);
        }
      }
    }
    else {
      while( true ) {
        uVar7 = sStack_20;
        uVar5 = std::__cxx11::string::size();
        local_1a9 = 0;
        if (uVar7 < uVar5) {
          bVar1 = isComment(&this->currentLine,sStack_20);
          local_1a9 = bVar1 ^ 0xff;
        }
        if ((local_1a9 & 1) == 0) break;
        sStack_20 = sStack_20 + 1;
      }
      createTokenCurrentString(this,EquValue,sStack_20 - this->linePos);
      this->equActive = false;
      Token::Token(__return_storage_ptr__,&this->token);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Token FileTokenizer::loadToken()
{
	if (isInputAtEnd())
	{
		createToken(TokenType::Invalid,0);
		return std::move(token);
	}

	size_t pos = linePos;

	if (equActive)
	{
		while (pos < currentLine.size() && !isComment(currentLine,pos))
			pos++;

		createTokenCurrentString(TokenType::EquValue,pos-linePos);

		equActive = false;
		return std::move(token);
	}

	if (parseOperator())
		return std::move(token);

	char first = currentLine[pos];

	// character constants
	if (first == '\'')
	{
		size_t decodePos = pos+1;

		auto value = int64_t(decodeUtf8Character(currentLine, decodePos));
		if (currentLine[decodePos] == '\'')
		{
			createToken(TokenType::Integer,decodePos+1-pos,value);
			return std::move(token);
		}
	}

	// strings
	if (first == '"')
	{
		std::string text;
		pos++;

		bool valid = false;
		while (pos < currentLine.size())
		{
			if (pos+1 < currentLine.size() && currentLine[pos] == '\\')
			{
				if (currentLine[pos+1] == '"')
				{
					text += '"';
					pos += 2;
					continue;
				}
				
				if (currentLine[pos+1] == '\\')
				{
					text += '\\';
					pos += 2;
					continue;
				}
			}

			if (currentLine[pos] == '"')
			{
				pos++;
				valid = true;
				break;
			}

			text += currentLine[pos++];
		}

		if (!valid)
		{
			createToken(TokenType::Invalid,pos-linePos, "Unexpected end of line in string constant");
			return std::move(token);
		}
		
		createToken(TokenType::String,pos-linePos,text);
		return std::move(token);
	}

	// numbers
	if (first >= '0' && first <= '9')
	{
		// find end of number
		size_t start = pos;
		size_t end = pos;
		bool isValid = true;
		bool foundPoint = false;
		bool foundExp = false;
		bool foundExpSign = false;
		bool isHex = start+1 < currentLine.size() && currentLine[start] == '0' && tolower(currentLine[start+1]) == 'x';

		while (end < currentLine.size() && (isalnum(currentLine[end]) || currentLine[end] == '.'))
		{
			if (currentLine[end] == '.')
			{
				if (foundExp || foundPoint)
					isValid = false;
				foundPoint = true;
			} else if (tolower(currentLine[end]) == 'h' && !foundExpSign) {
				isHex = true;
			} else if (tolower(currentLine[end]) == 'e' && !isHex)
			{
				if (foundExp)
				{
					isValid = false;
				} else if (end+1 < currentLine.size() && (currentLine[end+1] == '+' || currentLine[end+1] == '-')){
					end++;
					if (end+1 >= currentLine.size() || !isalnum(currentLine[end+1]))
						isValid = false;
					foundExpSign = true;
				}
				foundExp = true;
			}

			end++;
		}

		bool isFloat = foundPoint || (foundExp && !isHex);

		if (!isFloat)
		{
			int64_t value;
			if (!convertInteger(start,end,value))
			{
				createTokenCurrentString(TokenType::NumberString,end-start);
				return std::move(token);
			}

			createToken(TokenType::Integer,end-start,value);
		} else { // isFloat
			double value;
			if (!isValid)
			{
				createToken(TokenType::Invalid,end-start, "Invalid floating point number");
				return std::move(token);
			}

			if (!convertFloat(start,end,value))
			{
				createTokenCurrentString(TokenType::NumberString,end-start);
				return std::move(token);
			}

			createToken(TokenType::Float,end-start,value);
		}
		
		return std::move(token);
	}

	// identifiers
	bool isFirst = true;
	while (pos < currentLine.size() && Global.symbolTable.isValidSymbolCharacter(currentLine[pos],isFirst))
	{
		pos++;
		isFirst = false;
	}

	if (pos == linePos)
	{
		auto characterStart = pos;
		auto value = decodeUtf8Character(currentLine, pos);
		std::string text = tfm::format("Invalid input '%s'",convertUnicodeCharToUtf8(value));
		createToken(TokenType::Invalid,pos-characterStart,text);
		return std::move(token);
	}

	std::string text = currentLine.substr(linePos,pos-linePos);
	bool textLowered = false;
	// Lowercase is common, let's try to avoid a copy.
	if (std::any_of(text.begin(), text.end(), ::iswupper))
	{
		std::transform(text.begin(), text.end(), text.begin(), ::tolower);
		textLowered = true;
	}

	if (text == "equ")
	{
		createToken(TokenType::Equ,pos-linePos);
		equActive = true;
	} else if (textLowered) {
		createToken(TokenType::Identifier,pos-linePos,text);
	} else {
		createTokenCurrentString(TokenType::Identifier,pos-linePos);
	}

	return std::move(token);
}